

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O0

Tree flutes_c(int d,int *xs,int *ys,int *s,int acc)

{
  undefined8 uVar1;
  Branch *pBVar2;
  dl_el_s *pdVar3;
  dl_el *pdVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  Tree TVar7;
  dl_el *_el_1;
  Branch *local_90;
  Branch *local_88;
  Branch *local_80;
  dl_t _curr_dl;
  dl_el *_next;
  dl_el *_el;
  Tree tdup;
  Tree t;
  int i;
  int acc_local;
  int *s_local;
  int *ys_local;
  int *xs_local;
  dl_el_s *pdStack_18;
  int d_local;
  Branch *local_10;
  
  _next = ht[d]->first;
  do {
    if (_next == (dl_el *)0x0) {
      if (d < 10) {
        TVar7 = flutes_LD(d,xs,ys,s);
        local_88 = TVar7._0_8_;
        tdup.branch = local_88;
        local_80 = TVar7.branch;
        t._0_8_ = local_80;
      }
      else {
        TVar7 = flutes_MD(d,xs,ys,s,acc);
        _el_1 = TVar7._0_8_;
        tdup.branch = (Branch *)_el_1;
        local_90 = TVar7.branch;
        t._0_8_ = local_90;
      }
      pdVar3 = (dl_el_s *)malloc((long)(d * 2 + -2) * 0xc);
      for (t.branch._0_4_ = d * 2 + -3; -1 < (int)t.branch; t.branch._0_4_ = (int)t.branch + -1) {
        puVar5 = (undefined8 *)((long)&pdVar3->prev + (long)(int)t.branch * 0xc);
        puVar6 = (undefined8 *)(t._0_8_ + (long)(int)t.branch * 0xc);
        *puVar5 = *puVar6;
        *(undefined4 *)(puVar5 + 1) = *(undefined4 *)(puVar6 + 1);
      }
      pdVar4 = (dl_el *)malloc(0x20);
      if (pdVar4 == (dl_el *)0x0) {
        printf("Out of memory!!\n");
      }
      else {
        pdVar4[1].prev = (dl_el_s *)tdup.branch;
        pdVar4[1].next = pdVar3;
        pdVar4->prev = (dl_el_s *)0x0;
        if (ht[d]->count == 0) {
          pdVar4->next = (dl_el_s *)0x0;
          ht[d]->last = pdVar4;
          ht[d]->first = pdVar4;
          ht[d]->count = 1;
        }
        else {
          pdVar4->next = ht[d]->first;
          ht[d]->first->prev = pdVar4;
          ht[d]->first = pdVar4;
          ht[d]->count = ht[d]->count + 1;
        }
      }
      pdStack_18 = (dl_el_s *)tdup.branch;
      local_10 = (Branch *)t._0_8_;
      goto LAB_001586ab;
    }
    pdStack_18 = _next[1].prev;
    pdVar3 = _next[1].next;
    t.branch._0_4_ = 0;
    while ((((int)t.branch < d &&
            (*(int *)((long)&pdVar3->prev + (long)(int)t.branch * 0xc + 4) == ys[(int)t.branch])) &&
           (*(int *)((long)&pdVar3->prev + (long)(int)t.branch * 0xc) == xs[s[(int)t.branch]]))) {
      t.branch._0_4_ = (int)t.branch + 1;
    }
    _next = _next->next;
  } while ((int)t.branch < d);
  local_10 = (Branch *)malloc((long)(d * 2 + -2) * 0xc);
  for (t.branch._0_4_ = d * 2 + -3; -1 < (int)t.branch; t.branch._0_4_ = (int)t.branch + -1) {
    pBVar2 = local_10 + (int)t.branch;
    puVar5 = (undefined8 *)((long)&pdVar3->prev + (long)(int)t.branch * 0xc);
    uVar1 = *puVar5;
    pBVar2->x = (int)uVar1;
    pBVar2->y = (int)((ulong)uVar1 >> 0x20);
    pBVar2->n = *(int *)(puVar5 + 1);
  }
LAB_001586ab:
  TVar7.branch = local_10;
  TVar7._0_8_ = pdStack_18;
  return TVar7;
}

Assistant:

Tree flutes_c(int d, DTYPE *xs, DTYPE *ys, int *s, int acc)
{
  int i;
  //int orig_ht_flag;
  Tree t, tdup;

#if USE_HASHING
  dl_forall(Tree, ht[d], t) {
    for (i=0; i<d; i++) {
      if (t.branch[i].y != ys[i] || t.branch[i].x != xs[s[i]]) {
	break;
      }
    }
    if (i >= d) { // found a match
      tdup = t;
      tdup.branch = (Branch*)malloc(sizeof(Branch)*(2*d-2));
      for (i=2*d-3; i>=0; i--) {
	tdup.branch[i] = t.branch[i];
      }
      return tdup;
    }
  } dl_endfor;

  //orig_ht_flag = new_ht;
  //new_ht = 0;
#endif

  t = flutes_LMD(d, xs, ys, s, acc);

#if USE_HASHING
  //new_ht = orig_ht_flag;
      
  tdup = t;
  tdup.branch = (Branch*)malloc(sizeof(Branch)*(2*d-2));
  for (i=2*d-3; i>=0; i--) {
    tdup.branch[i] = t.branch[i];
  }
  dl_prepend(Tree, ht[d], tdup);
#endif  

  return t;
}